

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void parse(t_program *program,t_program *parent_program)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  char *pcVar4;
  undefined8 uVar5;
  reference pptVar6;
  t_scope *local_128;
  string *x_1;
  __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_> local_b0;
  t_program **local_a8;
  __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_> local_a0;
  iterator iter;
  vector<t_program_*,_std::allocator<t_program_*>_> *includes;
  string *x;
  string local_78;
  string local_58;
  string local_38 [8];
  string path;
  t_program *parent_program_local;
  t_program *program_local;
  
  path.field_2._8_8_ = parent_program;
  psVar3 = t_program::get_path_abi_cxx11_(program);
  std::__cxx11::string::string(local_38,(string *)psVar3);
  std::__cxx11::string::string((string *)&local_78,local_38);
  directory_name(&local_58,&local_78);
  std::__cxx11::string::operator=((string *)&g_curdir_abi_cxx11_,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::operator=((string *)&g_curpath_abi_cxx11_,local_38);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  yyin = (FILE *)fopen(pcVar4,"r");
  if ((FILE *)yyin == (FILE *)0x0) {
    uVar5 = std::__cxx11::string::c_str();
    failure("Could not open input file: \"%s\"",uVar5);
  }
  bVar1 = skip_utf8_bom(yyin);
  if (bVar1) {
    uVar5 = std::__cxx11::string::c_str();
    pverbose("Skipped UTF-8 BOM at %s\n",uVar5);
  }
  uVar5 = std::__cxx11::string::c_str();
  pverbose("Scanning %s for includes\n",uVar5);
  g_parse_mode = INCLUDES;
  g_program = program;
  g_scope = t_program::scope(program);
  yylineno = 1;
  iVar2 = yyparse();
  if (iVar2 != 0) {
    failure("Parser error during include pass.");
  }
  fclose((FILE *)yyin);
  iter._M_current = (t_program **)t_program::get_includes(program);
  __gnu_cxx::
  __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
  __normal_iterator(&local_a0);
  local_a8 = (t_program **)
             std::vector<t_program_*,_std::allocator<t_program_*>_>::begin(iter._M_current);
  local_a0._M_current = local_a8;
  while( true ) {
    local_b0._M_current =
         (t_program **)std::vector<t_program_*,_std::allocator<t_program_*>_>::end(iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_a0,&local_b0);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
              ::operator*(&local_a0);
    parse(*pptVar6,program);
    __gnu_cxx::
    __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
    operator++(&local_a0);
  }
  reset_program_doctext_info();
  g_parse_mode = PROGRAM;
  g_program = program;
  g_scope = t_program::scope(program);
  if (path.field_2._8_8_ == 0) {
    local_128 = (t_scope *)0x0;
  }
  else {
    local_128 = t_program::scope((t_program *)path.field_2._8_8_);
  }
  g_parent_scope = local_128;
  psVar3 = t_program::get_name_abi_cxx11_(program);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x_1,psVar3,
                 ".");
  std::__cxx11::string::operator=((string *)&g_parent_prefix_abi_cxx11_,(string *)&x_1);
  std::__cxx11::string::~string((string *)&x_1);
  std::__cxx11::string::operator=((string *)&g_curpath_abi_cxx11_,local_38);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  yyin = (FILE *)fopen(pcVar4,"r");
  if ((FILE *)yyin == (FILE *)0x0) {
    uVar5 = std::__cxx11::string::c_str();
    failure("Could not open input file: \"%s\"",uVar5);
  }
  bVar1 = skip_utf8_bom(yyin);
  if (bVar1) {
    uVar5 = std::__cxx11::string::c_str();
    pverbose("Skipped UTF-8 BOM at %s\n",uVar5);
  }
  uVar5 = std::__cxx11::string::c_str();
  pverbose("Parsing %s for types\n",uVar5);
  yylineno = 1;
  iVar2 = yyparse();
  if (iVar2 != 0) {
    failure("Parser error during types pass.");
  }
  fclose((FILE *)yyin);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void parse(t_program *program, t_program *parent_program) {
    // Get scope file path
    string path = program->get_path();

    // Set current dir global, which is used in the include_file function
    g_curdir = directory_name(path);
    g_curpath = path;

    // Open the file
    // skip UTF-8 BOM if there is one
    yyin = fopen(path.c_str(), "r");
    if (yyin == 0) {
        failure("Could not open input file: \"%s\"", path.c_str());
    }
    if (skip_utf8_bom(yyin))
        pverbose("Skipped UTF-8 BOM at %s\n", path.c_str());

    // Create new scope and scan for includes
    pverbose("Scanning %s for includes\n", path.c_str());
    g_parse_mode = INCLUDES;
    g_program = program;
    g_scope = program->scope();
    try {
        yylineno = 1;
        if (yyparse() != 0) {
            failure("Parser error during include pass.");
        }
    } catch (string &x) {
        failure(x.c_str());
    }
    fclose(yyin);

    // Recursively parse all the include programs
    vector<t_program *> &includes = program->get_includes();
    vector<t_program *>::iterator iter;
    for (iter = includes.begin(); iter != includes.end(); ++iter) {
        parse(*iter, program);
    }

    // reset program doctext status before parsing a new file
    reset_program_doctext_info();

    // Parse the program file
    g_parse_mode = PROGRAM;
    g_program = program;
    g_scope = program->scope();
    g_parent_scope = (parent_program != nullptr) ? parent_program->scope() : nullptr;
    g_parent_prefix = program->get_name() + ".";
    g_curpath = path;

    // Open the file
    // skip UTF-8 BOM if there is one
    yyin = fopen(path.c_str(), "r");
    if (yyin == 0) {
        failure("Could not open input file: \"%s\"", path.c_str());
    }
    if (skip_utf8_bom(yyin))
        pverbose("Skipped UTF-8 BOM at %s\n", path.c_str());

    pverbose("Parsing %s for types\n", path.c_str());
    yylineno = 1;
    try {
        if (yyparse() != 0) {
            failure("Parser error during types pass.");
        }
    } catch (string &x) {
        failure(x.c_str());
    }
    fclose(yyin);
}